

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

TCGv_ptr get_fpstatus_ptr_aarch64(TCGContext_conflict1 *tcg_ctx,_Bool is_f16)

{
  TCGv_ptr ret;
  undefined7 in_register_00000031;
  
  ret = tcg_temp_new_ptr(tcg_ctx);
  tcg_gen_addi_i64_aarch64
            (tcg_ctx,(TCGv_i64)ret,(TCGv_i64)tcg_ctx->cpu_env,
             (CONCAT71(in_register_00000031,is_f16) & 0xffffffff) * 8 + 0x2ec8);
  return ret;
}

Assistant:

static TCGv_ptr get_fpstatus_ptr(TCGContext *tcg_ctx, int neon)
{
    TCGv_ptr statusptr = tcg_temp_new_ptr(tcg_ctx);
    int offset;
    if (neon) {
        offset = offsetof(CPUARMState, vfp.standard_fp_status);
    } else {
        offset = offsetof(CPUARMState, vfp.fp_status);
    }
    tcg_gen_addi_ptr(tcg_ctx, statusptr, tcg_ctx->cpu_env, offset);
    return statusptr;
}